

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializeEngine.cpp
# Opt level: O3

XSerializeEngine * __thiscall
xercesc_4_0::XSerializeEngine::operator<<(XSerializeEngine *this,short sh)

{
  short *psVar1;
  
  checkAndFlushBuffer(this,(ulong)((uint)this->fBufCur & 1) | 2);
  psVar1 = (short *)(this->fBufCur + ((uint)this->fBufCur & 1));
  this->fBufCur = (XMLByte *)psVar1;
  if (((ulong)psVar1 & 1) == 0) {
    *psVar1 = sh;
    this->fBufCur = (XMLByte *)(psVar1 + 1);
    return this;
  }
  __assert_fail("((XMLSize_t) fBufCur % size)==0",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XSerializeEngine.cpp"
                ,0x472,"void xercesc_4_0::XSerializeEngine::alignBufCur(XMLSize_t)");
}

Assistant:

XSerializeEngine& XSerializeEngine::operator<<(short sh)
{
    checkAndFlushBuffer(calBytesNeeded(sizeof(short)));

    alignBufCur(sizeof(short));
    *reinterpret_cast<short*>(fBufCur) = sh;
    fBufCur += sizeof(short);
    return *this;
}